

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void * absl::base_internal::DoAllocWithArena(size_t request,Arena *arena)

{
  AllocList *head;
  long *plVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  AllocList *e;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  AllocList *pAVar11;
  int *piVar12;
  ArenaLock section;
  AllocList *prev [30];
  ArenaLock local_1b8;
  AllocList *local_128 [31];
  
  if (request == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    anon_unknown_0::ArenaLock::ArenaLock(&local_1b8,arena);
    if (0xffffffffffffffdf < request) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a");
    }
    sVar3 = arena->round_up;
    uVar10 = request + sVar3 + 0x1f;
    if (uVar10 < request + 0x20) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a");
    }
    uVar10 = uVar10 & -sVar3;
    head = &arena->freelist;
    do {
      iVar6 = LLA_SkiplistLevels(uVar10,arena->min_size,(uint32_t *)0x0);
      if ((arena->freelist).levels < iVar6) {
LAB_0014b420:
        LOCK();
        uVar7 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i =
             (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
        UNLOCK();
        if (7 < uVar7) {
          SpinLock::SlowUnlock(&arena->mu,uVar7);
        }
        sVar3 = arena->pagesize;
        uVar9 = (uVar10 - 1) + sVar3 * 0x10;
        if (uVar9 < uVar10) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a");
        }
        uVar9 = uVar9 & sVar3 * -0x10;
        if ((arena->flags & 2) == 0) {
          e = (AllocList *)mmap((void *)0x0,uVar9,3,0x22,-1,0);
        }
        else {
          e = (AllocList *)syscall(9,0,uVar9,3,0x22,0xffffffffffffffff,0);
        }
        if (e == (AllocList *)0xffffffffffffffff) {
          puVar8 = (uint *)__errno_location();
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x23a,"mmap error: %d",(ulong)*puVar8);
        }
        uVar7 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        if ((uVar7 & 1) == 0) {
          LOCK();
          uVar2 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
          if (uVar7 == uVar2) {
            (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar7 | 1;
            uVar2 = uVar7;
          }
          uVar7 = uVar2;
          UNLOCK();
        }
        if ((uVar7 & 1) != 0) {
          SpinLock::SlowLock(&arena->mu);
        }
        (e->header).size = uVar9;
        (e->header).magic = (ulong)e ^ 0x4c833e95;
        (e->header).arena = arena;
        bVar5 = false;
        AddToFreelist(&e->levels,arena);
      }
      else {
        pAVar11 = head;
        while( true ) {
          if (pAVar11->levels < iVar6) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1c6,"Check %s failed: %s","i < prev->levels");
          }
          e = pAVar11->next[iVar6 + -1];
          if (e == (AllocList *)0x0) break;
          if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                       "next->header.magic == Magic(kMagicUnallocated, &next->header)");
          }
          if ((e->header).arena != arena) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1cc,"Check %s failed: %s",
                       "next->header.arena == arena");
          }
          if (head != pAVar11) {
            if (e <= pAVar11) {
              raw_logging_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1ce,"Check %s failed: %s","prev < next");
            }
            if (e <= (AllocList *)((long)pAVar11->next + ((pAVar11->header).size - 0x28))) {
              raw_logging_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1d1,"Check %s failed: %s",
                         "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                        );
            }
          }
          bVar5 = true;
          if ((e == (AllocList *)0x0) || (pAVar11 = e, uVar10 <= (e->header).size))
          goto LAB_0014b412;
        }
        bVar5 = false;
LAB_0014b412:
        if (e == (AllocList *)0x0) goto LAB_0014b420;
      }
    } while (!bVar5);
    LLA_SkiplistDelete(head,e,local_128);
    uVar9 = arena->min_size;
    if (CARRY8(uVar9,uVar10)) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a",
                 "LowLevelAlloc arithmetic overflow");
    }
    uVar4 = (e->header).size;
    if (uVar9 + uVar10 <= uVar4) {
      plVar1 = (long *)((long)e->next + (uVar10 - 0x28));
      *plVar1 = uVar4 - uVar10;
      plVar1[1] = (long)e->next + (uVar10 - 0x28) ^ 0x4c833e95;
      plVar1[2] = (long)arena;
      (e->header).size = uVar10;
      AddToFreelist(plVar1 + 4,arena);
    }
    (e->header).magic = (ulong)e ^ 0x4c833e95;
    if ((e->header).arena != arena) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x254,"Check %s failed: %s","s->header.arena == arena",
                 "");
    }
    arena->allocation_count = arena->allocation_count + 1;
    anon_unknown_0::ArenaLock::Leave(&local_1b8);
    piVar12 = &e->levels;
    anon_unknown_0::ArenaLock::~ArenaLock(&local_1b8);
  }
  return piVar12;
}

Assistant:

static void *DoAllocWithArena(size_t request, LowLevelAlloc::Arena *arena) {
  void *result = nullptr;
  if (request != 0) {
    AllocList *s;       // will point to region that satisfies request
    ArenaLock section(arena);
    // round up with header
    size_t req_rnd = RoundUp(CheckedAdd(request, sizeof (s->header)),
                             arena->round_up);
    for (;;) {      // loop until we find a suitable region
      // find the minimum levels that a block of this size must have
      int i = LLA_SkiplistLevels(req_rnd, arena->min_size, nullptr) - 1;
      if (i < arena->freelist.levels) {   // potential blocks exist
        AllocList *before = &arena->freelist;  // predecessor of s
        while ((s = Next(i, before, arena)) != nullptr &&
               s->header.size < req_rnd) {
          before = s;
        }
        if (s != nullptr) {       // we found a region
          break;
        }
      }
      // we unlock before mmap() both because mmap() may call a callback hook,
      // and because it may be slow.
      arena->mu.Unlock();
      // mmap generous 64K chunks to decrease
      // the chances/impact of fragmentation:
      size_t new_pages_size = RoundUp(req_rnd, arena->pagesize * 16);
      void *new_pages;
#ifdef _WIN32
      new_pages = VirtualAlloc(0, new_pages_size,
                               MEM_RESERVE | MEM_COMMIT, PAGE_READWRITE);
      ABSL_RAW_CHECK(new_pages != nullptr, "VirtualAlloc failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
        new_pages = base_internal::DirectMmap(nullptr, new_pages_size,
            PROT_WRITE|PROT_READ, MAP_ANONYMOUS|MAP_PRIVATE, -1, 0);
      } else {
        new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
      }
#else
      new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                       MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if (new_pages == MAP_FAILED) {
        ABSL_RAW_LOG(FATAL, "mmap error: %d", errno);
      }

#endif  // _WIN32
      arena->mu.Lock();
      s = reinterpret_cast<AllocList *>(new_pages);
      s->header.size = new_pages_size;
      // Pretend the block is allocated; call AddToFreelist() to free it.
      s->header.magic = Magic(kMagicAllocated, &s->header);
      s->header.arena = arena;
      AddToFreelist(&s->levels, arena);  // insert new region into free list
    }
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, s, prev);    // remove from free list
    // s points to the first free region that's big enough
    if (CheckedAdd(req_rnd, arena->min_size) <= s->header.size) {
      // big enough to split
      AllocList *n = reinterpret_cast<AllocList *>
                        (req_rnd + reinterpret_cast<char *>(s));
      n->header.size = s->header.size - req_rnd;
      n->header.magic = Magic(kMagicAllocated, &n->header);
      n->header.arena = arena;
      s->header.size = req_rnd;
      AddToFreelist(&n->levels, arena);
    }
    s->header.magic = Magic(kMagicAllocated, &s->header);
    ABSL_RAW_CHECK(s->header.arena == arena, "");
    arena->allocation_count++;
    section.Leave();
    result = &s->levels;
  }
  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(result, request);
  return result;
}